

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory.cpp
# Opt level: O1

bool __thiscall QSharedMemory::lock(QSharedMemory *this)

{
  QObjectData *pQVar1;
  QArrayData *data;
  Data *pDVar2;
  QObject **ppQVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QAnyStringView a;
  QString local_50;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QObject).d_ptr.d;
  if (pQVar1[2].field_0x30 == '\x01') {
    lock();
  }
  else {
    bVar4 = QSystemSemaphore::acquire((QSystemSemaphore *)&pQVar1[2].children.d.size);
    if (!bVar4) {
      QMetaObject::tr(&local_50,&staticMetaObject,"%1: unable to lock",(char *)0x0,-1);
      a.m_size = 0x4000000000000013;
      a.field_0.m_data_utf8 = "QSharedMemory::lock";
      QString::arg_impl(&local_38,&local_50,a,0,(QChar)0x20);
      data = (QArrayData *)pQVar1[2].parent;
      pDVar2 = pQVar1[2].children.d.d;
      pQVar1[2].parent = (QObject *)local_38.d.d;
      pQVar1[2].children.d.d = (Data *)local_38.d.ptr;
      ppQVar3 = pQVar1[2].children.d.ptr;
      pQVar1[2].children.d.ptr = (QObject **)local_38.d.size;
      local_38.d.d = (Data *)data;
      local_38.d.ptr = (char16_t *)pDVar2;
      local_38.d.size = (qsizetype)ppQVar3;
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,2,0x10);
        }
      }
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar1[2].postedEvents.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 6;
      bVar4 = false;
      goto LAB_0021bcdd;
    }
    pQVar1[2].field_0x30 = 1;
  }
  bVar4 = true;
LAB_0021bcdd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QSharedMemory::lock()
{
    Q_D(QSharedMemory);
    if (d->lockedByMe) {
        qWarning("QSharedMemory::lock: already locked");
        return true;
    }
    if (d->systemSemaphore.acquire()) {
        d->lockedByMe = true;
        return true;
    }
    const auto function = "QSharedMemory::lock"_L1;
    d->errorString = QSharedMemory::tr("%1: unable to lock").arg(function);
    d->error = QSharedMemory::LockError;
    return false;
}